

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall
chrono::robosimian::RS_WheelDD::RS_WheelDD
          (RS_WheelDD *this,string *name,int id,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChSystem *system)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChFrame *pCVar3;
  undefined1 auVar4 [16];
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  shared_ptr<chrono::ChMaterialSurface> local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  ChQuaternion<double> local_c8;
  undefined1 local_a8 [136];
  
  local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  p_Var2 = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RS_Part::RS_Part(&this->super_RS_Part,name,&local_118,system);
  if (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_RS_Part)._vptr_RS_Part = (_func_int **)&PTR__RS_Part_0017da30;
  local_f8 = 0;
  local_e8 = 0x3f847ae147ae147b;
  uStack_e0 = 0x3f847ae147ae147b;
  local_d8 = 0x3f947ae147ae147b;
  local_108 = 0;
  uStack_100 = 0;
  *(int *)((this->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x28) = id;
  chrono::ChVariablesBodyOwnMass::SetBodyMass(3.4925);
  pCVar3 = (ChFrame *)
           (this->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c8.m_data[0] = 1.0;
  local_c8.m_data[1] = 0.0;
  local_c8.m_data[2] = 0.0;
  local_c8.m_data[3] = 0.0;
  local_a8._0_8_ = &PTR__ChFrame_0017db90;
  local_a8._8_8_ = 0.0;
  local_a8._16_8_ = 0.0;
  local_a8._24_8_ = 0.0;
  local_a8._32_8_ = 1.0;
  local_a8._40_8_ = 0.0;
  local_a8._48_8_ = 0.0;
  local_a8._56_8_ = 0.0;
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)(local_a8 + 0x40),&local_c8);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF(pCVar3);
  chrono::ChBody::SetInertiaXX
            ((this->super_RS_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  chrono::ChBody::SetInertiaXY
            ((this->super_RS_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_128 = (this->super_RS_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Stack_120 = (this->super_RS_Part).m_body.
                super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  p_Var2 = (this->super_RS_Part).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(system,&local_128);
  if (p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
  }
  chrono::Q_from_AngX(1.5707963267948966);
  local_a8._0_8_ = 0.0;
  local_a8._8_8_ = 0.0;
  local_a8._16_8_ = 0.0;
  local_a8._24_8_ = local_c8.m_data[0];
  local_a8._32_8_ = local_c8.m_data[1];
  local_a8._40_8_ = local_c8.m_data[2];
  local_a8._48_8_ = local_c8.m_data[3];
  local_a8._56_8_ = 0.074;
  local_a8._64_8_ = 0.038;
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::emplace_back<chrono::robosimian::CylinderShape>
            (&(this->super_RS_Part).m_cylinders,(CylinderShape *)local_a8);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_RS_Part).m_mesh_name,0,
             (char *)(this->super_RS_Part).m_mesh_name._M_string_length,0x16980b);
  auVar4._8_4_ = 0x3e99999a;
  auVar4._0_8_ = 0x3e99999a3e99999a;
  auVar4._12_4_ = 0x3e99999a;
  (this->super_RS_Part).m_offset.m_data[2] = 0.0;
  (this->super_RS_Part).m_offset.m_data[0] = 0.0;
  (this->super_RS_Part).m_offset.m_data[1] = 0.0;
  uVar1 = vmovlps_avx(auVar4);
  (this->super_RS_Part).m_color.R = (float)(int)uVar1;
  (this->super_RS_Part).m_color.G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_RS_Part).m_color.B = 0.3;
  return;
}

Assistant:

RS_WheelDD::RS_WheelDD(const std::string& name, int id, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : RS_Part(name, mat, system) {
    double mass = 3.492500;
    ChVector<> com(0, 0, 0);
    ChVector<> inertia_xx(0.01, 0.01, 0.02);
    ChVector<> inertia_xy(0, 0, 0);

    m_body->SetIdentifier(id);
    m_body->SetMass(mass);
    m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
    m_body->SetInertiaXX(inertia_xx);
    m_body->SetInertiaXY(inertia_xy);
    system->Add(m_body);

    m_cylinders.push_back(CylinderShape(ChVector<>(0, 0, 0), Q_from_AngX(CH_C_PI_2), 0.074, 0.038));

    m_mesh_name = "robosim_dd_wheel";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.3f, 0.3f, 0.3f);
}